

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

size_t __thiscall
pbrt::
HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
::FindOffset(HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
             *this,LightHandle *key)

{
  anon_struct_8_0_00000001_for___align aVar1;
  optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int nProbes;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  aVar1 = (anon_struct_8_0_00000001_for___align)
          (key->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar3 = ((ulong)aVar1 & 0xffffffffffff) * -0x395b586ca42e166b;
  uVar3 = ((uVar3 >> 0x2f ^ uVar3) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) * -0x395b586ca42e166b
  ;
  uVar4 = (uVar3 >> 0x2f ^ uVar3) * -0x395b586ca42e166b;
  poVar2 = (this->table).ptr;
  uVar5 = (this->table).nStored - 1;
  uVar6 = 0;
  do {
    uVar7 = (ulong)(uVar6 * uVar6 >> 1) + (ulong)(uVar6 >> 1) + ((uVar4 >> 0x2f ^ uVar4) & uVar5) &
            uVar5;
    if (poVar2[uVar7].set == true) {
      bVar8 = aVar1 != poVar2[uVar7].optionalValue.__align;
      if (!bVar8) {
        uVar3 = uVar7;
      }
    }
    else {
      bVar8 = false;
      uVar3 = uVar7;
    }
    uVar6 = uVar6 + 1;
  } while (bVar8);
  return uVar3;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }